

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred.c
# Opt level: O2

void ihevc_weighted_pred_chroma_bi_default
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  uint uVar1;
  uint uVar2;
  UWORD8 UVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar2 = 0;
  uVar1 = wd * 2;
  if (wd * 2 < 1) {
    uVar1 = uVar2;
  }
  if (ht < 1) {
    ht = uVar2;
  }
  for (uVar5 = 0; uVar5 != ht; uVar5 = uVar5 + 1) {
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      uVar4 = (int)pi2_src2[uVar6] + (int)pi2_src1[uVar6] + lvl_shift1 + lvl_shift2 + 0x40 >> 7;
      if ((int)uVar4 < 1) {
        uVar4 = uVar2;
      }
      UVar3 = (UWORD8)uVar4;
      if (0xfe < (int)uVar4) {
        UVar3 = 0xff;
      }
      pu1_dst[uVar6] = UVar3;
    }
    pu1_dst = pu1_dst + dst_strd;
    pi2_src2 = pi2_src2 + src_strd2;
    pi2_src1 = pi2_src1 + src_strd1;
  }
  return;
}

Assistant:

void ihevc_weighted_pred_chroma_bi_default(WORD16 *pi2_src1,
                                           WORD16 *pi2_src2,
                                           UWORD8 *pu1_dst,
                                           WORD32 src_strd1,
                                           WORD32 src_strd2,
                                           WORD32 dst_strd,
                                           WORD32 lvl_shift1,
                                           WORD32 lvl_shift2,
                                           WORD32 ht,
                                           WORD32 wd)
{
    WORD32 row, col;
    WORD32 i4_tmp;
    WORD32 shift;

    shift = SHIFT_14_MINUS_BIT_DEPTH + 1;
    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col++)
        {
            i4_tmp = pi2_src1[col] + lvl_shift1;
            i4_tmp += pi2_src2[col] + lvl_shift2;
            i4_tmp += 1 << (shift - 1);

            pu1_dst[col] = CLIP_U8(i4_tmp >> shift);
        }

        pi2_src1 += src_strd1;
        pi2_src2 += src_strd2;
        pu1_dst += dst_strd;
    }
}